

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

void __thiscall CInput::MouseModeRelative(CInput *this)

{
  int iVar1;
  char *pcVar2;
  
  if (this->m_MouseInputRelative != false) {
    return;
  }
  this->m_MouseInputRelative = true;
  SDL_ShowCursor(0);
  pcVar2 = "0";
  if (this->m_pConfig->m_InpGrab == 0) {
    pcVar2 = "1";
  }
  iVar1 = SDL_SetHintWithPriority("SDL_MOUSE_RELATIVE_MODE_WARP",pcVar2,2);
  if (iVar1 == 0) {
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"input","unable to switch relative mouse mode",0);
  }
  SDL_SetRelativeMouseMode(1);
  SDL_GetRelativeMouseState(0,0);
  return;
}

Assistant:

void CInput::MouseModeRelative()
{
	if(!m_MouseInputRelative)
	{
		m_MouseInputRelative = true;
		SDL_ShowCursor(SDL_DISABLE);
		if(SDL_SetHintWithPriority(SDL_HINT_MOUSE_RELATIVE_MODE_WARP, Config()->m_InpGrab ? "0" : "1", SDL_HINT_OVERRIDE) == SDL_FALSE)
		{
			Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "input", "unable to switch relative mouse mode");
		}
		SDL_SetRelativeMouseMode(SDL_TRUE);
		SDL_GetRelativeMouseState(NULL, NULL);
	}
}